

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O2

void btTransformUtil::integrateTransform
               (btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,btScalar timeStep,
               btTransform *predictedTransform)

{
  undefined1 auVar1 [16];
  uint uVar2;
  btScalar bVar3;
  float fVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar5;
  undefined4 uVar6;
  btVector3 bVar7;
  btQuaternion predictedOrn;
  btQuaternion orn0;
  btScalar local_8c;
  btVector3 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  btQuadWord local_48;
  btQuadWord local_38;
  
  local_8c = timeStep;
  local_88 = operator*(linvel,&local_8c);
  bVar7 = operator+(&curTrans->m_origin,&local_88);
  *&(predictedTransform->m_origin).m_floats = bVar7.m_floats;
  bVar3 = btVector3::length(angvel);
  uVar2 = -(uint)(0.7853982 < bVar3 * local_8c);
  local_58 = (float)(~uVar2 & (uint)bVar3 | (uint)(0.7853982 / local_8c) & uVar2);
  if (0.001 <= local_58) {
    uVar5 = 0;
    uVar6 = 0;
    fVar4 = sinf(local_8c * local_58 * 0.5);
    fVar4 = fVar4 / local_58;
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    fVar4 = local_8c * 0.5 + local_8c * local_8c * local_8c * -0.020833334 * local_58 * local_58;
  }
  local_88.m_floats[0] = fVar4;
  bVar7 = operator*(angvel,local_88.m_floats);
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_8_ = bVar7.m_floats._0_8_;
  local_68._12_4_ = extraout_XMM0_Dd;
  local_78._8_4_ = uVar5;
  local_78._0_8_ = bVar7.m_floats._8_8_;
  local_78._12_4_ = uVar6;
  local_88.m_floats[3] = cosf(local_8c * local_58 * 0.5);
  auVar1 = local_68;
  local_88.m_floats[2] = (btScalar)local_78._0_4_;
  local_88.m_floats[0] = (btScalar)local_68._0_4_;
  local_88.m_floats[1] = (btScalar)local_68._4_4_;
  local_68 = auVar1;
  local_38.m_floats = (btScalar  [4])btTransform::getRotation(curTrans);
  local_48.m_floats = (btScalar  [4])operator*((btQuaternion *)&local_88,(btQuaternion *)&local_38);
  btQuaternion::normalize((btQuaternion *)&local_48);
  btMatrix3x3::setRotation(&predictedTransform->m_basis,(btQuaternion *)&local_48);
  return;
}

Assistant:

static void integrateTransform(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep,btTransform& predictedTransform)
	{
		predictedTransform.setOrigin(curTrans.getOrigin() + linvel * timeStep);
//	#define QUATERNION_DERIVATIVE
	#ifdef QUATERNION_DERIVATIVE
		btQuaternion predictedOrn = curTrans.getRotation();
		predictedOrn += (angvel * predictedOrn) * (timeStep * btScalar(0.5));
		predictedOrn.normalize();
	#else
		//Exponential map
		//google for "Practical Parameterization of Rotations Using the Exponential Map", F. Sebastian Grassia

		btVector3 axis;
		btScalar	fAngle = angvel.length(); 
		//limit the angular motion
		if (fAngle*timeStep > ANGULAR_MOTION_THRESHOLD)
		{
			fAngle = ANGULAR_MOTION_THRESHOLD / timeStep;
		}

		if ( fAngle < btScalar(0.001) )
		{
			// use Taylor's expansions of sync function
			axis   = angvel*( btScalar(0.5)*timeStep-(timeStep*timeStep*timeStep)*(btScalar(0.020833333333))*fAngle*fAngle );
		}
		else
		{
			// sync(fAngle) = sin(c*fAngle)/t
			axis   = angvel*( btSin(btScalar(0.5)*fAngle*timeStep)/fAngle );
		}
		btQuaternion dorn (axis.x(),axis.y(),axis.z(),btCos( fAngle*timeStep*btScalar(0.5) ));
		btQuaternion orn0 = curTrans.getRotation();

		btQuaternion predictedOrn = dorn * orn0;
		predictedOrn.normalize();
	#endif
		predictedTransform.setRotation(predictedOrn);
	}